

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_print(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  size_t in_RAX;
  char *ptr;
  ulong uVar2;
  long lVar3;
  JSValue val1;
  size_t len;
  size_t local_38;
  
  if (0 < argc) {
    lVar3 = 0;
    local_38 = in_RAX;
    do {
      if (lVar3 != 0) {
        putchar(0x20);
      }
      val1.tag = *(int64_t *)((long)&argv->tag + lVar3);
      val1.u.ptr = ((JSValueUnion *)((long)&argv->u + lVar3))->ptr;
      ptr = JS_ToCStringLen2(ctx,&local_38,val1,0);
      if (ptr == (char *)0x0) {
        uVar2 = 6;
        goto LAB_0010f107;
      }
      fwrite(ptr,1,local_38,_stdout);
      JS_FreeCString(ctx,ptr);
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar3);
  }
  putchar(10);
  uVar2 = 3;
LAB_0010f107:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (JSValue)(auVar1 << 0x40);
}

Assistant:

static JSValue js_print(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    int i;
    const char *str;
    size_t len;

    for(i = 0; i < argc; i++) {
        if (i != 0)
            putchar(' ');
        str = JS_ToCStringLen(ctx, &len, argv[i]);
        if (!str)
            return JS_EXCEPTION;
        fwrite(str, 1, len, stdout);
        JS_FreeCString(ctx, str);
    }
    putchar('\n');
    return JS_UNDEFINED;
}